

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O0

void av1_alloc_mb_data(AV1_COMP *cpi,macroblock *mb)

{
  int iVar1;
  macroblock *mb_00;
  void *pvVar2;
  AV1_COMP *in_RSI;
  size_t in_RDI;
  int max_sb_square_y;
  SPEED_FEATURES *sf;
  AV1_COMMON *cm;
  
  mb_00 = (macroblock *)(in_RDI + 0x3bf80);
  if (*(int *)(in_RDI + 0x60cb0) == 0) {
    if (*(int *)(in_RDI + 0x60c28) != 0) {
      pvVar2 = aom_malloc(0x2635aa);
      *(void **)((long)((in_RSI->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xd) + 0x10) =
           pvVar2;
      if (*(long *)((long)((in_RSI->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xd) + 0x10) ==
          0) {
        aom_internal_error((aom_internal_error_info *)mb_00->plane[0].src.buf,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mb->txfm_search_info.mb_rd_record");
      }
    }
    iVar1 = frame_is_intra_only((AV1_COMMON *)mb_00);
    if (iVar1 == 0) {
      pvVar2 = aom_malloc(0x263603);
      *(void **)((in_RSI->td).mb.mode_costs.palette_y_color_cost[1][0] + 6) = pvVar2;
      if (*(long *)((in_RSI->td).mb.mode_costs.palette_y_color_cost[1][0] + 6) == 0) {
        aom_internal_error((aom_internal_error_info *)mb_00->plane[0].src.buf,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mb->inter_modes_info");
      }
    }
  }
  av1_alloc_src_diff_buf((AV1Common *)in_RSI,mb_00);
  pvVar2 = aom_memalign(in_RDI,(size_t)in_RSI);
  *(void **)(in_RSI->enc_quant_dequant_params).quants.y_zbin[0xba] = pvVar2;
  if (*(long *)(in_RSI->enc_quant_dequant_params).quants.y_zbin[0xba] == 0) {
    aom_internal_error((aom_internal_error_info *)mb_00->plane[0].src.buf,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate mb->e_mbd.seg_mask");
  }
  allocate_winner_mode_stats(in_RSI,mb_00);
  pvVar2 = aom_memalign(in_RDI,(size_t)in_RSI);
  *(void **)((long)((in_RSI->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 0x18) = pvVar2;
  if (*(long *)((long)((in_RSI->td).mb.coeff_costs.coeff_costs[2][1].base_cost + 0xe) + 0x18) == 0)
  {
    aom_internal_error((aom_internal_error_info *)mb_00->plane[0].src.buf,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate mb->dqcoeff_buf");
  }
  return;
}

Assistant:

static inline void av1_alloc_mb_data(const AV1_COMP *cpi,
                                     struct macroblock *mb) {
  const AV1_COMMON *cm = &cpi->common;
  const SPEED_FEATURES *sf = &cpi->sf;
  if (!sf->rt_sf.use_nonrd_pick_mode) {
    // Memory for mb_rd_record is allocated only when use_mb_rd_hash sf is
    // enabled.
    if (sf->rd_sf.use_mb_rd_hash)
      CHECK_MEM_ERROR(cm, mb->txfm_search_info.mb_rd_record,
                      (MB_RD_RECORD *)aom_malloc(sizeof(MB_RD_RECORD)));
    if (!frame_is_intra_only(cm))
      CHECK_MEM_ERROR(
          cm, mb->inter_modes_info,
          (InterModesInfo *)aom_malloc(sizeof(*mb->inter_modes_info)));
  }

  av1_alloc_src_diff_buf(cm, mb);

  CHECK_MEM_ERROR(cm, mb->e_mbd.seg_mask,
                  (uint8_t *)aom_memalign(
                      16, 2 * MAX_SB_SQUARE * sizeof(mb->e_mbd.seg_mask[0])));

  allocate_winner_mode_stats(cpi, mb);

  const int max_sb_square_y = 1
                              << num_pels_log2_lookup[cm->seq_params->sb_size];
  CHECK_MEM_ERROR(
      cm, mb->dqcoeff_buf,
      (tran_low_t *)aom_memalign(32, max_sb_square_y * sizeof(tran_low_t)));
}